

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_setup_tpl_buffers
               (AV1_PRIMARY *ppi,CommonModeInfoParams *mi_params,int width,int height,
               int byte_alignment,int lag_in_frames)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  undefined8 unaff_RBX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int frame_1;
  TplDepFrame *tpl_frame;
  int mi_rows;
  int mi_cols;
  int frame;
  int alloc_y_plane_only;
  uint8_t block_mis_log2;
  TplParams *tpl_data;
  SequenceHeader *seq_params;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_5c;
  undefined1 *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  int width_00;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar5;
  long lVar6;
  
  lVar6 = in_RDI;
  set_tpl_stats_block_size((uint8_t *)(in_RDI + 0xd2ac),(uint8_t *)(in_RDI + 0xd2ad));
  bVar1 = *(byte *)(in_RDI + 0xd2ac);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
  *(uint *)(in_RDI + 0x12350) = *(byte *)(in_RDI + 0xd2ad) + 0x27 & 0xffffffe0;
  uVar2 = (uint)(*(int *)(*(long *)(lVar6 + 0x160) + 0x60924) != 0);
  for (width_00 = 0; width_00 < 0x69; width_00 = width_00 + 1) {
    in_stack_ffffffffffffffb8 = *(int *)(in_RSI + 0x10) + 0x1fU & 0xffffffe0;
    in_stack_ffffffffffffffb4 = *(int *)(in_RSI + 0xc) + 0x1fU & 0xffffffe0;
    in_stack_ffffffffffffffa8 = (undefined1 *)(in_RDI + 0xd2b0 + (long)width_00 * 0x60);
    *in_stack_ffffffffffffffa8 = 0;
    *(int *)(in_stack_ffffffffffffffa8 + 0x44) = (int)in_stack_ffffffffffffffb8 >> (bVar1 & 0x1f);
    *(int *)(in_stack_ffffffffffffffa8 + 0x48) = (int)in_stack_ffffffffffffffb4 >> (bVar1 & 0x1f);
    *(undefined4 *)(in_stack_ffffffffffffffa8 + 0x40) =
         *(undefined4 *)(in_RDI + (long)width_00 * 0x60 + 0xd2f4);
    *(undefined4 *)(in_stack_ffffffffffffffa8 + 0x4c) = *(undefined4 *)(in_RSI + 0xc);
    *(undefined4 *)(in_stack_ffffffffffffffa8 + 0x50) = *(undefined4 *)(in_RSI + 0x10);
  }
  *(long *)(in_RDI + 0x12298) = in_RDI + 0xd610;
  if (1 < in_R9D) {
    pvVar4 = aom_calloc(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    *(void **)(in_RDI + 0xfb90) = pvVar4;
    if (*(long *)(in_RDI + 0xfb90) == 0) {
      aom_internal_error((aom_internal_error_info *)(lVar6 + 0xc760),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_data->txfm_stats_list");
    }
    for (local_5c = 0; local_5c < in_R9D; local_5c = local_5c + 1) {
      pvVar4 = aom_calloc(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      *(void **)(in_RDI + 0xfa10 + (long)local_5c * 8) = pvVar4;
      if (*(long *)(in_RDI + 0xfa10 + (long)local_5c * 8) == 0) {
        aom_internal_error((aom_internal_error_info *)(lVar6 + 0xc760),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tpl_data->tpl_stats_pool[frame]");
      }
      in_stack_ffffffffffffff88 = 0;
      in_stack_ffffffffffffff80 = in_R8D;
      iVar3 = aom_alloc_frame_buffer
                        ((YV12_BUFFER_CONFIG *)CONCAT44(uVar5,uVar2),width_00,
                         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                         (int)lVar6,(int)unaff_RBX,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0)
                         ,in_stack_00000008);
      if (iVar3 != 0) {
        aom_internal_error((aom_internal_error_info *)(lVar6 + 0xc760),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate frame buffer");
      }
    }
  }
  return;
}

Assistant:

void av1_setup_tpl_buffers(AV1_PRIMARY *const ppi,
                           CommonModeInfoParams *const mi_params, int width,
                           int height, int byte_alignment, int lag_in_frames) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  TplParams *const tpl_data = &ppi->tpl_data;
  set_tpl_stats_block_size(&tpl_data->tpl_stats_block_mis_log2,
                           &tpl_data->tpl_bsize_1d);
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  tpl_data->border_in_pixels =
      ALIGN_POWER_OF_TWO(tpl_data->tpl_bsize_1d + 2 * AOM_INTERP_EXTEND, 5);

  const int alloc_y_plane_only =
      ppi->cpi->sf.tpl_sf.use_y_only_rate_distortion ? 1 : 0;
  for (int frame = 0; frame < MAX_LENGTH_TPL_FRAME_STATS; ++frame) {
    const int mi_cols =
        ALIGN_POWER_OF_TWO(mi_params->mi_cols, MAX_MIB_SIZE_LOG2);
    const int mi_rows =
        ALIGN_POWER_OF_TWO(mi_params->mi_rows, MAX_MIB_SIZE_LOG2);
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame];
    tpl_frame->is_valid = 0;
    tpl_frame->width = mi_cols >> block_mis_log2;
    tpl_frame->height = mi_rows >> block_mis_log2;
    tpl_frame->stride = tpl_data->tpl_stats_buffer[frame].width;
    tpl_frame->mi_rows = mi_params->mi_rows;
    tpl_frame->mi_cols = mi_params->mi_cols;
  }
  tpl_data->tpl_frame = &tpl_data->tpl_stats_buffer[REF_FRAMES + 1];

  // If lag_in_frames <= 1, TPL module is not invoked. Hence dynamic memory
  // allocations are avoided for buffers in tpl_data.
  if (lag_in_frames <= 1) return;

  AOM_CHECK_MEM_ERROR(&ppi->error, tpl_data->txfm_stats_list,
                      aom_calloc(MAX_LENGTH_TPL_FRAME_STATS,
                                 sizeof(*tpl_data->txfm_stats_list)));

  for (int frame = 0; frame < lag_in_frames; ++frame) {
    AOM_CHECK_MEM_ERROR(
        &ppi->error, tpl_data->tpl_stats_pool[frame],
        aom_calloc(tpl_data->tpl_stats_buffer[frame].width *
                       tpl_data->tpl_stats_buffer[frame].height,
                   sizeof(*tpl_data->tpl_stats_buffer[frame].tpl_stats_ptr)));

    if (aom_alloc_frame_buffer(
            &tpl_data->tpl_rec_pool[frame], width, height,
            seq_params->subsampling_x, seq_params->subsampling_y,
            seq_params->use_highbitdepth, tpl_data->border_in_pixels,
            byte_alignment, false, alloc_y_plane_only))
      aom_internal_error(&ppi->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate frame buffer");
  }
}